

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes.c
# Opt level: O0

void nes_ineschr(int *ip)

{
  int iVar1;
  int svalue;
  int *ip_local;
  
  iVar1 = evaluate(ip,';');
  if (iVar1 != 0) {
    if (((int)value < 0) || (0x40 < (int)value)) {
      error("Prg bank value out of range!");
    }
    else {
      ines_chr = value;
      if (pass == 1) {
        println();
      }
    }
  }
  return;
}

Assistant:

void
nes_ineschr(int *ip)
{
	if (!evaluate(ip, ';'))
		return;

    int svalue = (int)value;
	if ((svalue < 0) || (svalue > 64)) 
	{
		error("Prg bank value out of range!");
	
		return;
	}
	
	ines_chr = value;

	if (pass == LAST_PASS) 
	{
		println();
	}
}